

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateVkImpl::ShaderStageInfo::ShaderStageInfo
          (ShaderStageInfo *this,ShaderVkImpl *pShader)

{
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l;
  initializer_list<const_Diligent::ShaderVkImpl_*> __l_00;
  ShaderDesc *pSVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b8;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_79;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  allocator<const_Diligent::ShaderVkImpl_*> local_31;
  ShaderVkImpl *local_30;
  iterator local_28;
  size_type local_20;
  ShaderVkImpl *local_18;
  ShaderVkImpl *pShader_local;
  ShaderStageInfo *this_local;
  
  local_18 = pShader;
  pShader_local = (ShaderVkImpl *)this;
  pSVar1 = DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                      *)pShader);
  this->Type = pSVar1->ShaderType;
  local_30 = local_18;
  local_28 = &local_30;
  local_20 = 1;
  std::allocator<const_Diligent::ShaderVkImpl_*>::allocator(&local_31);
  __l_00._M_len = local_20;
  __l_00._M_array = local_28;
  std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
  vector(&this->Shaders,__l_00,&local_31);
  std::allocator<const_Diligent::ShaderVkImpl_*>::~allocator(&local_31);
  local_78 = &local_70;
  __x = ShaderVkImpl::GetSPIRV(local_18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,__x);
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_70;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_79);
  __l._M_len = (size_type)
               local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  __l._M_array = (iterator)
                 local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->SPIRVs,__l,&local_79);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_79);
  local_b8 = &local_58;
  do {
    local_b8 = local_b8 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(local_b8);
  } while (local_b8 != &local_70);
  return;
}

Assistant:

PipelineStateVkImpl::ShaderStageInfo::ShaderStageInfo(const ShaderVkImpl* pShader) :
    Type{pShader->GetDesc().ShaderType},
    Shaders{pShader},
    SPIRVs{pShader->GetSPIRV()}
{}